

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O1

bool __thiscall ROM::Request::Node::subtract(Node *this,Map *map)

{
  _Base_ptr p_Var1;
  iterator __position;
  _Base_ptr p_Var2;
  byte bVar3;
  byte bVar4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  
  if (this->type == One) {
    p_Var2 = (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &(map->_M_t)._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var5->_M_header;
    if (p_Var2 != (_Base_ptr)0x0) {
      do {
        if ((int)this->name <= (int)p_Var2[1]._M_color) {
          p_Var1 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < (int)this->name];
      } while (p_Var2 != (_Base_ptr)0x0);
    }
    p_Var2 = &p_Var5->_M_header;
    if (((_Rb_tree_header *)p_Var1 != p_Var5) &&
       (p_Var2 = p_Var1, (int)this->name < (int)p_Var1[1]._M_color)) {
      p_Var2 = &p_Var5->_M_header;
    }
    bVar6 = (_Rb_tree_header *)p_Var2 != p_Var5;
  }
  else {
    __position._M_current =
         (this->children).
         super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (__position._M_current ==
        (this->children).super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = 0;
      bVar4 = 1;
    }
    else {
      bVar4 = 1;
      bVar3 = 0;
      do {
        bVar6 = subtract(__position._M_current,map);
        if (bVar6) {
          __position = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::
                       _M_erase(&this->children,__position);
        }
        else {
          __position._M_current = __position._M_current + 1;
        }
        bVar4 = bVar4 & bVar6;
        bVar3 = bVar3 | bVar6;
      } while (__position._M_current !=
               (this->children).
               super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    bVar6 = true;
    if ((this->type != All) || (bVar4 == 0)) {
      bVar6 = (bool)(this->type == Any & bVar3);
    }
  }
  return bVar6;
}

Assistant:

bool Request::Node::subtract(const ROM::Map &map) {
	switch(type) {
		case Type::One:
		return map.find(name) != map.end();

		default: {
			bool has_all = true;
			bool has_any = false;

			auto iterator = children.begin();
			while(iterator != children.end()) {
				const bool did_subtract = iterator->subtract(map);
				has_all &= did_subtract;
				has_any |= did_subtract;
				if(did_subtract) {
					iterator = children.erase(iterator);
				} else {
					++iterator;
				}
			}

			return (type == Type::All && has_all) || (type == Type::Any && has_any);
		}
	}
}